

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_writeSkippableFrame
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize,uint magicVariant)

{
  ulong in_RCX;
  void *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint in_R8D;
  BYTE *op;
  U32 val32;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  if (in_RSI < in_RCX + 8) {
    local_8 = 0xffffffffffffffba;
  }
  else if (in_RCX < 0x100000000) {
    if (in_R8D < 0x10) {
      val32 = (U32)((ulong)in_RDI >> 0x20);
      MEM_writeLE32((void *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),val32);
      MEM_writeLE32((void *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),val32);
      memcpy((void *)(in_RDI + 8),in_RDX,in_RCX);
      local_8 = in_RCX + 8;
    }
    else {
      local_8 = 0xffffffffffffffd6;
    }
  }
  else {
    local_8 = 0xffffffffffffffb8;
  }
  return local_8;
}

Assistant:

size_t ZSTD_writeSkippableFrame(void* dst, size_t dstCapacity,
                                const void* src, size_t srcSize, unsigned magicVariant) {
    BYTE* op = (BYTE*)dst;
    RETURN_ERROR_IF(dstCapacity < srcSize + ZSTD_SKIPPABLEHEADERSIZE /* Skippable frame overhead */,
                    dstSize_tooSmall, "Not enough room for skippable frame");
    RETURN_ERROR_IF(srcSize > (unsigned)0xFFFFFFFF, srcSize_wrong, "Src size too large for skippable frame");
    RETURN_ERROR_IF(magicVariant > 15, parameter_outOfBound, "Skippable frame magic number variant not supported");

    MEM_writeLE32(op, (U32)(ZSTD_MAGIC_SKIPPABLE_START + magicVariant));
    MEM_writeLE32(op+4, (U32)srcSize);
    ZSTD_memcpy(op+8, src, srcSize);
    return srcSize + ZSTD_SKIPPABLEHEADERSIZE;
}